

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_context.c
# Opt level: O0

int test_contexts_digest(char *name)

{
  int iVar1;
  char *in_RDI;
  int ret;
  EVP_MD *type;
  int in_stack_000001bc;
  EVP_MD *in_stack_000001c0;
  EVP_MD *local_10;
  
  ERR_set_mark();
  local_10 = EVP_get_digestbyname(in_RDI);
  if (local_10 == (EVP_MD *)0x0) {
    local_10 = (EVP_MD *)EVP_MD_fetch(0,in_RDI);
    if (local_10 == (EVP_MD *)0x0) {
      ERR_print_errors_fp(_stderr);
      OPENSSL_die("(type = (EVP_MD *)EVP_get_digestbyname(name)) || (type = EVP_MD_fetch(NULL, name, NULL))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                  ,0xf0);
    }
  }
  ERR_pop_to_mark();
  printf("\x1b[1;34mDigest test for %s\x1b[m\n",in_RDI);
  iVar1 = test_contexts_digest_or_legacy_mac(in_stack_000001c0,in_stack_000001bc);
  EVP_MD_free(local_10);
  return iVar1;
}

Assistant:

static int test_contexts_digest(const char *name)
{
    EVP_MD *type;
    ERR_set_mark();
    T((type = (EVP_MD *)EVP_get_digestbyname(name))
      || (type = EVP_MD_fetch(NULL, name, NULL)));
    ERR_pop_to_mark();

    printf(cBLUE "Digest test for %s" cNORM "\n", name);
    int ret = test_contexts_digest_or_legacy_mac(type, 0);
    EVP_MD_free(type);
    return ret;
}